

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O1

void event_disable_debug_mode(void)

{
  event_debug_entry *__ptr;
  event *peVar1;
  ulong uVar2;
  uint uVar3;
  event_debug_entry **ppeVar4;
  
  if (event_debug_map_lock_ != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,event_debug_map_lock_);
  }
  ppeVar4 = global_debug_map.hth_table;
  for (uVar2 = (ulong)global_debug_map.hth_table_length; uVar2 != 0; uVar2 = uVar2 - 1) {
    if (*ppeVar4 != (event_debug_entry *)0x0) goto LAB_0022f38f;
    ppeVar4 = ppeVar4 + 1;
  }
  ppeVar4 = (event_debug_entry **)0x0;
LAB_0022f38f:
  do {
    if (ppeVar4 == (event_debug_entry **)0x0) {
      event_debug_map_HT_CLEAR(&global_debug_map);
      if (event_debug_map_lock_ != (void *)0x0) {
        (*evthread_lock_fns_.unlock)(0,event_debug_map_lock_);
      }
      event_debug_mode_on_ = 0;
      return;
    }
    __ptr = *ppeVar4;
    peVar1 = __ptr->ptr;
    *ppeVar4 = (__ptr->node).hte_next;
    global_debug_map.hth_n_entries = global_debug_map.hth_n_entries - 1;
    if (*ppeVar4 == (event_debug_entry *)0x0) {
      uVar2 = ((ulong)peVar1 >> 6 & 0x3ffffff) % (ulong)global_debug_map.hth_table_length;
      do {
        uVar3 = (int)uVar2 + 1;
        uVar2 = (ulong)uVar3;
        if (global_debug_map.hth_table_length <= uVar3) {
          ppeVar4 = (event_debug_entry **)0x0;
          goto LAB_0022f37a;
        }
      } while (global_debug_map.hth_table[uVar3] == (event_debug_entry *)0x0);
      ppeVar4 = global_debug_map.hth_table + uVar3;
    }
LAB_0022f37a:
    if (mm_free_fn_ == (_func_void_void_ptr *)0x0) {
      free(__ptr);
    }
    else {
      (*mm_free_fn_)(__ptr);
    }
  } while( true );
}

Assistant:

void
event_disable_debug_mode(void)
{
#ifndef EVENT__DISABLE_DEBUG_MODE
	struct event_debug_entry **ent, *victim;

	EVLOCK_LOCK(event_debug_map_lock_, 0);
	for (ent = HT_START(event_debug_map, &global_debug_map); ent; ) {
		victim = *ent;
		ent = HT_NEXT_RMV(event_debug_map, &global_debug_map, ent);
		mm_free(victim);
	}
	HT_CLEAR(event_debug_map, &global_debug_map);
	EVLOCK_UNLOCK(event_debug_map_lock_ , 0);

	event_debug_mode_on_  = 0;
#endif
}